

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall imrt::Station::Station(Station *this,Station *s)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type pMVar3;
  int iVar4;
  int iVar5;
  list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *plVar6;
  mapped_type *ppMVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  Matrix local_78;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_68;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *local_60;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *local_48;
  Matrix *local_40;
  list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *local_38;
  
  this->_vptr_Station = (_func_int **)&PTR__Station_0013bbe8;
  p_Var1 = &(this->D)._M_t._M_impl.super__Rb_tree_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = &this->A;
  local_38 = (list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff;
  (this->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->last_mem).first.first = 0;
  (this->last_mem).first.second = 0;
  (this->last_mem).second.first = 0;
  (this->last_mem).second.second = 0;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_38;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)local_38;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collimator = s->collimator;
  local_40 = &this->I;
  maths::Matrix::Matrix(local_40);
  local_50 = &this->intensity;
  (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = &this->pos2beam;
  p_Var1 = &(this->pos2beam)._M_t._M_impl.super__Rb_tree_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = &this->beam2pos;
  p_Var1 = &(this->beam2pos)._M_t._M_impl.super__Rb_tree_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = &this->int2nb;
  p_Var1 = &(this->int2nb)._M_t._M_impl.super__Rb_tree_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Collimator::operator=(this->collimator,s->collimator);
  this->angle = s->angle;
  iVar2 = s->max_intensity;
  iVar4 = s->min_intensity;
  iVar5 = s->initial_intensity;
  this->max_apertures = s->max_apertures;
  this->max_intensity = iVar2;
  this->min_intensity = iVar4;
  this->initial_intensity = iVar5;
  this->step_intensity = s->step_intensity;
  iVar2 = s->n_volumes;
  this->n_volumes = iVar2;
  local_78.rows_ = 0;
  if (0 < iVar2) {
    p_Var1 = &(s->D)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var9 = (s->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var1->_M_header;
      p_Var10 = p_Var1;
      if (p_Var9 != (_Base_ptr)0x0) {
        do {
          if (local_78.rows_ <= (int)*(size_t *)(p_Var9 + 1)) {
            p_Var8 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < local_78.rows_];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
           (p_Var10 = (_Rb_tree_header *)p_Var8,
           local_78.rows_ < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var10 = p_Var1;
        }
      }
      pMVar3 = *(mapped_type *)(p_Var10 + 1);
      ppMVar7 = std::
                map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                ::operator[](&this->D,&local_78.rows_);
      *ppMVar7 = pMVar3;
      local_78.rows_ = local_78.rows_ + 1;
    } while (local_78.rows_ < this->n_volumes);
  }
  maths::Matrix::Matrix(&local_78,&s->I);
  plVar6 = local_38;
  maths::Matrix::operator=(local_40,&local_78);
  maths::Matrix::~Matrix(&local_78);
  std::vector<double,_std::allocator<double>_>::operator=(local_50,&s->intensity);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::operator=(local_48,&s->A);
  (this->last_mem).first = (s->last_mem).first;
  (this->last_mem).second = (s->last_mem).second;
  if (this != s) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              (plVar6,(s->last_diff).
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,&s->last_diff);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::operator=(&local_58->_M_t,&(s->pos2beam)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::operator=(&local_60->_M_t,&(s->beam2pos)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&local_68->_M_t,&(s->int2nb)._M_t);
  return;
}

Assistant:

Station::Station(const Station &s): collimator(s.collimator){
    collimator=s.collimator;
    angle=s.angle;
    max_apertures=s.max_apertures;
    max_intensity=s.max_intensity;
    min_intensity=s.min_intensity;
    initial_intensity=s.initial_intensity;
    step_intensity=s.step_intensity;
    n_volumes=s.n_volumes;
    for (int i=0; i<n_volumes; i++){
      const Matrix * aux= s.D.find(i)->second;
      D[i]=aux;
    }
    //I=s.I;
    I= Matrix (s.I);
    intensity=s.intensity;
    A=s.A;
    last_mem=s.last_mem;
    last_diff=s.last_diff;
    pos2beam=s.pos2beam;
    beam2pos=s.beam2pos;
    int2nb=s.int2nb;
  }